

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O1

void remove_filelist(HtsVoiceFilelist *list)

{
  HtsVoiceFilelist *__ptr;
  HtsVoiceFilelist *__ptr_00;
  
  if (list == (HtsVoiceFilelist *)0x0) {
    __ptr = (HtsVoiceFilelist *)0x0;
  }
  else {
    __ptr_00 = (HtsVoiceFilelist *)0x0;
    do {
      __ptr = list;
      if (__ptr_00 != (HtsVoiceFilelist *)0x0) {
        free(__ptr_00);
      }
      if ((__ptr->field_1).pathSjis != (char *)0x0) {
        free((__ptr->field_1).pathSjis);
      }
      if ((__ptr->field_2).nameSjis != (char *)0x0) {
        free((__ptr->field_2).nameSjis);
      }
      list = __ptr->succ;
      __ptr_00 = __ptr;
    } while (__ptr->succ != (HtsVoiceFilelist_tag *)0x0);
  }
  if (__ptr == (HtsVoiceFilelist *)0x0) {
    return;
  }
  free(__ptr);
  return;
}

Assistant:

void remove_filelist(HtsVoiceFilelist *list)
{
	HtsVoiceFilelist *prev = NULL;
	while (list != NULL)
	{
		if (prev != NULL)
		{
			free(prev);
		}
		if (list->path)
		{
			free(list->path);
		}
		if (list->name)
		{
			free(list->name);
		}
		prev = list;
		list = list->succ;
	}
	if (prev != NULL)
	{
		free(prev);
	}
}